

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void __thiscall CTestNet4Params::CTestNet4Params(CTestNet4Params *this)

{
  span<const_std::byte,_18446744073709551615UL> b;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<AssumeutxoData> __l_01;
  initializer_list<std::pair<const_int,_uint256>_> __l_02;
  bool bVar1;
  reference pvVar2;
  less<int> *__comp;
  map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *this_00;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *testnet4_genesis_msg;
  CScript testnet4_genesis_script;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffbdc;
  array<std::byte,_33UL> *in_stack_fffffffffffffbe0;
  CBlock *b_00;
  CBlock *in_stack_fffffffffffffbe8;
  allocator_type *in_stack_fffffffffffffbf0;
  CBlockHeader *in_stack_fffffffffffffbf8;
  size_type in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  opcodetype in_stack_fffffffffffffc0c;
  allocator_type *in_stack_fffffffffffffc10;
  allocator_type *__a;
  uchar *in_stack_fffffffffffffc18;
  vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *this_01;
  uint8_t *__a_00;
  CChainParams *in_stack_fffffffffffffc38;
  iterator ppVar4;
  uchar *puVar5;
  undefined8 in_stack_fffffffffffffc60;
  uint32_t nBits;
  undefined8 in_stack_fffffffffffffc68;
  CScript *in_stack_fffffffffffffc70;
  undefined6 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7e;
  undefined1 in_stack_fffffffffffffc7f;
  allocator_type local_2b0 [16];
  int32_t in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  pair<const_int,_uint256> local_290;
  undefined1 local_251;
  CBlock local_238;
  undefined1 local_1c0;
  undefined1 local_1bf;
  undefined1 local_1be;
  undefined1 local_1bd;
  undefined1 local_1bc;
  undefined1 local_1bb;
  undefined1 local_1ba;
  undefined1 local_1b9;
  undefined1 local_1b8;
  undefined1 local_1b7;
  undefined1 local_1b6;
  undefined1 local_1b5;
  undefined1 local_1b4;
  undefined1 local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined1 local_1b0;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  undefined1 local_1a8;
  undefined1 local_1a7;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 local_1a0;
  undefined1 local_19f;
  undefined1 local_19e;
  undefined1 local_19d;
  undefined1 local_19c;
  undefined1 local_19b;
  undefined1 local_19a;
  undefined1 local_199;
  undefined1 local_198;
  undefined1 local_197;
  undefined1 local_196;
  undefined1 local_195;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  undefined1 local_190;
  undefined1 local_18f;
  undefined1 local_18e;
  undefined1 local_18d;
  undefined1 local_18c;
  undefined1 local_18b;
  undefined1 local_18a;
  undefined1 local_189;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  nBits = (uint32_t)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(in_stack_fffffffffffffc38);
  *(undefined4 *)(in_RDI + 0x48) = 4;
  *(undefined1 *)(in_RDI + 0x2a) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  *(undefined4 *)(in_RDI + 4) = 210000;
  *(undefined4 *)(in_RDI + 0xb) = 1;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  *(undefined8 *)((long)in_RDI + 0x6c) = local_18;
  *(undefined8 *)((long)in_RDI + 0x74) = uStack_10;
  *(undefined8 *)((long)in_RDI + 0x5c) = local_28;
  *(undefined8 *)((long)in_RDI + 100) = uStack_20;
  *(undefined4 *)((long)in_RDI + 0x7c) = 1;
  *(undefined4 *)(in_RDI + 0x10) = 1;
  *(undefined4 *)((long)in_RDI + 0x84) = 1;
  *(undefined4 *)(in_RDI + 0x11) = 1;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  uStack_29 = 0;
  uStack_2a = 0;
  uStack_2b = 0;
  uStack_2c = 0;
  uStack_2d = 0xff;
  uStack_2e = 0xff;
  uStack_2f = 0xff;
  uStack_30 = 0xff;
  uStack_31 = 0xff;
  uStack_32 = 0xff;
  uStack_33 = 0xff;
  uStack_34 = 0xff;
  uStack_35 = 0xff;
  uStack_36 = 0xff;
  uStack_37 = 0xff;
  local_38 = 0xff;
  uStack_39 = 0xff;
  uStack_3a = 0xff;
  uStack_3b = 0xff;
  uStack_3c = 0xff;
  uStack_3d = 0xff;
  uStack_3e = 0xff;
  uStack_3f = 0xff;
  uStack_40 = 0xff;
  uStack_41 = 0xff;
  uStack_42 = 0xff;
  uStack_43 = 0xff;
  uStack_44 = 0xff;
  uStack_45 = 0xff;
  uStack_46 = 0xff;
  uStack_47 = 0xff;
  local_48 = 0xff;
  in_RDI[0x1d] = 0xffffffffffffffff;
  in_RDI[0x1e] = 0xffffffff;
  in_RDI[0x1b] = 0xffffffffffffffff;
  in_RDI[0x1c] = 0xffffffffffffffff;
  in_RDI[0x21] = 0x127500;
  in_RDI[0x20] = 600;
  *(undefined1 *)(in_RDI + 0x1f) = 1;
  *(undefined1 *)((long)in_RDI + 0xf9) = 1;
  *(undefined1 *)((long)in_RDI + 0xfa) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0x5e8;
  *(undefined4 *)((long)in_RDI + 0x94) = 0x7e0;
  *(undefined4 *)(in_RDI + 0x13) = 0x1c;
  in_RDI[0x14] = 0xfffffffffffffffe;
  in_RDI[0x15] = 0x7fffffffffffffff;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined4 *)(in_RDI + 0x17) = 2;
  in_RDI[0x18] = 0xffffffffffffffff;
  in_RDI[0x19] = 0x7fffffffffffffff;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  uStack_49 = 0;
  uStack_4a = 0;
  uStack_4b = 0;
  uStack_4c = 0;
  uStack_4d = 0;
  uStack_4e = 0;
  uStack_4f = 0;
  uStack_50 = 0;
  uStack_51 = 0;
  uStack_52 = 0;
  uStack_53 = 0;
  uStack_54 = 0;
  uStack_55 = 0;
  uStack_56 = 0;
  uStack_57 = 0;
  local_58 = 0;
  uStack_59 = 0;
  uStack_5a = 0;
  uStack_5b = 0;
  uStack_5c = 0;
  uStack_5d = 0;
  uStack_5e = 0;
  uStack_5f = 0;
  uStack_60 = 0x5f;
  uStack_61 = 0xaa;
  uStack_62 = 0x15;
  uStack_63 = 0xd0;
  uStack_64 = 0x2e;
  uStack_65 = 0x62;
  uStack_66 = 2;
  uStack_67 = 0xf3;
  local_68 = 0xba;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x22] = 0xaa15d02e6202f3ba;
  in_RDI[0x23] = 0x5f;
  uStack_69 = 0;
  uStack_6a = 0;
  uStack_6b = 0;
  uStack_6c = 0;
  uStack_6d = 0x5b;
  uStack_6e = 0xe3;
  uStack_6f = 0x48;
  uStack_70 = 5;
  uStack_71 = 0x7d;
  uStack_72 = 0xb9;
  uStack_73 = 0x91;
  uStack_74 = 0xfa;
  uStack_75 = 0x5d;
  uStack_76 = 0x89;
  uStack_77 = 0xfe;
  local_78 = 0x7c;
  uStack_79 = 0x46;
  uStack_7a = 0x95;
  uStack_7b = 0xb6;
  uStack_7c = 0x67;
  uStack_7d = 0xcf;
  uStack_7e = 0xb3;
  uStack_7f = 0x11;
  uStack_80 = 0x39;
  uStack_81 = 0x1a;
  uStack_82 = 0x8d;
  uStack_83 = 0xb3;
  uStack_84 = 0x74;
  uStack_85 = 0xb6;
  uStack_86 = 0xf6;
  uStack_87 = 0x81;
  local_88 = 0xfd;
  in_RDI[0x28] = 0x7db991fa5d89fe7c;
  in_RDI[0x29] = 0x5be34805;
  in_RDI[0x26] = 0x1a8db374b6f681fd;
  in_RDI[0x27] = 0x4695b667cfb31139;
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbe8,
                      (size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = '\x1c';
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbe8,
                      (size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = '\x16';
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbe8,
                      (size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = '?';
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbe8,
                      (size_type)in_stack_fffffffffffffbe0);
  *pvVar2 = '(';
  *(undefined2 *)((long)in_RDI + 0x174) = 0xbccd;
  in_RDI[0x2f] = 1000;
  in_RDI[0x30] = 1;
  in_RDI[0x31] = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<67UL>___0,_0,_0,_0,_0,_0,_0,_0,_0,_0,_______>();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_33UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbe0);
  b._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffc08;
  b._M_ptr = (pointer)in_stack_fffffffffffffc00;
  b._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffc0c;
  CScript::operator<<((CScript *)in_stack_fffffffffffffbe8,b);
  CScript::operator<<((CScript *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (CScript *)0x1e893e);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_238.super_CBlockHeader.nVersion = 0x2a05f200;
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  b_00 = &local_238;
  uVar3 = 1;
  CreateGenesisBlock((char *)CONCAT17(in_stack_fffffffffffffc7f,
                                      CONCAT16(in_stack_fffffffffffffc7e,in_stack_fffffffffffffc78))
                     ,in_stack_fffffffffffffc70,(uint32_t)((ulong)in_stack_fffffffffffffc68 >> 0x20)
                     ,(uint32_t)in_stack_fffffffffffffc68,nBits,in_stack_fffffffffffffd60,
                     (CAmount *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
  CBlock::operator=(in_stack_fffffffffffffbe8,b_00);
  CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  CBlockHeader::GetHash(in_stack_fffffffffffffbf8);
  in_RDI[2] = local_170;
  in_RDI[3] = uStack_168;
  *in_RDI = local_180;
  in_RDI[1] = uStack_178;
  local_181 = 0;
  local_182 = 0;
  local_183 = 0;
  local_184 = 0;
  local_185 = 0xda;
  local_186 = 0x84;
  local_187 = 0xf2;
  local_188 = 0xba;
  local_189 = 0xfb;
  local_18a = 0xbc;
  local_18b = 0x53;
  local_18c = 0xde;
  local_18d = 0xe2;
  local_18e = 0x5a;
  local_18f = 0x72;
  local_190 = 0xae;
  local_191 = 0x50;
  local_192 = 0x7f;
  local_193 = 0xf4;
  local_194 = 0x91;
  local_195 = 0x4b;
  local_196 = 0x86;
  local_197 = 0x7c;
  local_198 = 0x56;
  local_199 = 0x5b;
  local_19a = 0xe3;
  local_19b = 0x50;
  local_19c = 0xb0;
  local_19d = 0xda;
  local_19e = 0x8b;
  local_19f = 0xf0;
  local_1a0 = 0x43;
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffbe8,(base_blob<256U> *)b_00);
  if (!bVar1) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16d,"CTestNet4Params::CTestNet4Params()");
  }
  local_1a1 = 0x7a;
  local_1a2 = 0xa0;
  local_1a3 = 0xa7;
  local_1a4 = 0xae;
  local_1a5 = 0x1e;
  local_1a6 = 0x22;
  local_1a7 = 0x34;
  local_1a8 = 0x14;
  local_1a9 = 0xcb;
  local_1aa = 0x80;
  local_1ab = 0x7e;
  local_1ac = 0x40;
  local_1ad = 0xcd;
  local_1ae = 0x57;
  local_1af = 0xe6;
  local_1b0 = 0x67;
  local_1b1 = 0xb7;
  local_1b2 = 0x18;
  local_1b3 = 0xe4;
  local_1b4 = 0x2a;
  local_1b5 = 0xaf;
  local_1b6 = 0x93;
  local_1b7 = 6;
  local_1b8 = 0xdb;
  local_1b9 = 0x91;
  local_1ba = 2;
  local_1bb = 0xfe;
  local_1bc = 0x28;
  local_1bd = 0x91;
  local_1be = 0x2b;
  local_1bf = 0x7b;
  local_1c0 = 0x4e;
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffbe8,(base_blob<256U> *)b_00);
  if (!bVar1) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16e,"CTestNet4Params::CTestNet4Params()");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[36]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffbf8,(char (*) [36])in_stack_fffffffffffffbf0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffbf8,(char (*) [23])in_stack_fffffffffffffbf0);
  local_251 = 0x6f;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),in_stack_fffffffffffffc00
             ,(value_type_conflict *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)b_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  local_290.second.super_base_blob<256U>.m_data._M_elems[0x1b] = 0xc4;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),in_stack_fffffffffffffc00
             ,(value_type_conflict *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  puVar5 = local_290.second.super_base_blob<256U>.m_data._M_elems + 0x1c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)b_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),in_stack_fffffffffffffc00
             ,(value_type_conflict *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  ppVar4 = &local_290;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)b_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\x04';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '5';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = 0x87;
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 0xcf;
  __l._M_len._0_4_ = in_stack_fffffffffffffc08;
  __l._M_array = (iterator)in_stack_fffffffffffffc00;
  __l._M_len._4_4_ = in_stack_fffffffffffffc0c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8,__l)
  ;
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\x04';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '5';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 0x83;
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0x94;
  __l_00._M_len._0_4_ = in_stack_fffffffffffffc08;
  __l_00._M_array = (iterator)in_stack_fffffffffffffc00;
  __l_00._M_len._4_4_ = in_stack_fffffffffffffc0c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8,
             __l_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe8,(char *)b_00);
  __a_00 = chainparams_seed_testnet4;
  __comp = (less<int> *)
           std::begin<unsigned_char_const,72ul>
                     ((uchar (*) [72])CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  this_00 = (map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
            std::end<unsigned_char_const,72ul>
                      ((uchar (*) [72])CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a_00,(uchar *)__comp,
             in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  __a = local_2b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)b_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  *(undefined1 *)(in_RDI + 0x5a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2d1) = 0;
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_238.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_238.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  this_01 = (vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)&stack0xfffffffffffffd4d;
  std::allocator<std::pair<const_int,_uint256>_>::allocator
            ((allocator<std::pair<const_int,_uint256>_> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3))
  ;
  __l_02._M_len = (size_type)puVar5;
  __l_02._M_array = ppVar4;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            (this_00,__l_02,__comp,(allocator_type *)__a_00);
  CCheckpointData::operator=((CCheckpointData *)in_stack_fffffffffffffbe8,(CCheckpointData *)b_00);
  CCheckpointData::~CCheckpointData((CCheckpointData *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::allocator<std::pair<const_int,_uint256>_>::~allocator
            ((allocator<std::pair<const_int,_uint256>_> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3))
  ;
  std::initializer_list<AssumeutxoData>::initializer_list
            ((initializer_list<AssumeutxoData> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  std::allocator<AssumeutxoData>::allocator
            ((allocator<AssumeutxoData> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  __l_01._M_len = (size_type)__comp;
  __l_01._M_array = (iterator)__a_00;
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::vector(this_01,__l_01,__a);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::operator=
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)in_stack_fffffffffffffbe8,
             (vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)b_00);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::~vector
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)in_stack_fffffffffffffbe8);
  std::allocator<AssumeutxoData>::~allocator
            ((allocator<AssumeutxoData> *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  in_RDI[0x66] = 0x3f9014b75e17b8e7;
  in_RDI[100] = 0x66bcd676;
  in_RDI[0x65] = 0xb8ded;
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbdc,uVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTestNet4Params() {
        m_chain_type = ChainType::TESTNET4;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.BIP34Height = 1;
        consensus.BIP34Hash = uint256{};
        consensus.BIP65Height = 1;
        consensus.BIP66Height = 1;
        consensus.CSVHeight = 1;
        consensus.SegwitHeight = 1;
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = true;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1512; // 75% for testchains
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{"00000000000000000000000000000000000000000000005faa15d02e6202f3ba"};
        consensus.defaultAssumeValid = uint256{"000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd"}; // 39550

        pchMessageStart[0] = 0x1c;
        pchMessageStart[1] = 0x16;
        pchMessageStart[2] = 0x3f;
        pchMessageStart[3] = 0x28;
        nDefaultPort = 48333;
        nPruneAfterHeight = 1000;
        m_assumed_blockchain_size = 1;
        m_assumed_chain_state_size = 0;

        const char* testnet4_genesis_msg = "03/May/2024 000000000000000000001ebd58c244970b3aa9d783bb001011fbe8ea8e98e00e";
        const CScript testnet4_genesis_script = CScript() << "000000000000000000000000000000000000000000000000000000000000000000"_hex << OP_CHECKSIG;
        genesis = CreateGenesisBlock(testnet4_genesis_msg,
                testnet4_genesis_script,
                1714777860,
                393743547,
                0x1d00ffff,
                1,
                50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043"});
        assert(genesis.hashMerkleRoot == uint256{"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e"});

        vFixedSeeds.clear();
        vSeeds.clear();
        // nodes with support for servicebits filtering should be at the top
        vSeeds.emplace_back("seed.testnet4.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("seed.testnet4.wiz.biz."); // Jason Maurice

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_testnet4), std::end(chainparams_seed_testnet4));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                {},
            }
        };

        m_assumeutxo_data = {
            {}
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd
            .nTime    = 1723651702,
            .tx_count = 757229,
            .dTxRate  = 0.01570402633472492,
        };
    }